

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign<unsigned_char>
          (CImgDisplay *this,CImg<unsigned_char> *img,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  uchar *puVar1;
  CImg<unsigned_char> *this_00;
  byte *pbVar2;
  CImgDisplay *this_01;
  CImg<unsigned_char> *in_RSI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  CImg<unsigned_char> *nimg;
  CImg<unsigned_char> tmp;
  undefined2 in_stack_000000b0;
  bool in_stack_0000016a;
  bool in_stack_0000016b;
  uint in_stack_0000016c;
  char *in_stack_00000170;
  uint in_stack_00000178;
  uint in_stack_0000017c;
  CImgDisplay *in_stack_00000180;
  undefined1 in_stack_0000030f;
  CImg<unsigned_char> *in_stack_00000310;
  CImgDisplay *in_stack_00000318;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  CImg<unsigned_char> *in_stack_ffffffffffffff30;
  undefined1 wait_expose;
  CImgDisplay *in_stack_ffffffffffffff58;
  float *in_stack_ffffffffffffffa8;
  CImg<unsigned_char> local_48;
  byte local_26;
  byte local_25;
  CImg<unsigned_char> *local_18;
  CImgDisplay *local_8;
  
  _in_stack_000000b0 = CONCAT13(fullscreen_flag,CONCAT12(closed_flag,in_stack_000000b0));
  local_25 = in_R8B & 1;
  local_26 = in_R9B & 1;
  local_18 = in_RSI;
  puVar1 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)in_RSI);
  if (puVar1 == (uchar *)0x0) {
    local_8 = assign(in_stack_ffffffffffffff58);
  }
  else {
    CImg<unsigned_char>::CImg(&local_48);
    this_00 = local_18;
    if (local_18->_depth != 1) {
      CImg<unsigned_char>::get_projections2d
                ((CImg<unsigned_char> *)title,normalization_type,_in_stack_000000b0,tmp._data._4_4_)
      ;
      this_00 = CImg<unsigned_char>::operator=
                          (in_stack_ffffffffffffff30,
                           (CImg<unsigned_char> *)
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      CImg<unsigned_char>::~CImg(in_stack_ffffffffffffff30);
    }
    wait_expose = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
    _assign(in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000170,
            in_stack_0000016c,in_stack_0000016b,in_stack_0000016a);
    if (*(int *)(in_RDI + 0x20) == 2) {
      pbVar2 = CImg<unsigned_char>::min_max<float>(this_00,in_stack_ffffffffffffffa8);
      *(float *)(in_RDI + 0x49c) = (float)*pbVar2;
    }
    this_01 = render<unsigned_char>(in_stack_00000318,in_stack_00000310,(bool)in_stack_0000030f);
    local_8 = paint(this_01,(bool)wait_expose);
    CImg<unsigned_char>::~CImg((CImg<unsigned_char> *)local_8);
  }
  return local_8;
}

Assistant:

CImgDisplay& assign(const CImg<T>& img, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!img) return assign();
      CImg<T> tmp;
      const CImg<T>& nimg = (img._depth==1)?img:(tmp=img.get_projections2d(img._width/2,img._height/2,img._depth/2));
      _assign(nimg._width,nimg._height,title,normalization_type,fullscreen_flag,closed_flag);
      if (_normalization==2) _min = (float)nimg.min_max(_max);
      return render(nimg).paint();
    }